

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int oldParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *filename_00;
  int iStack_5c;
  char *pcStack_58;
  undefined8 uStack_50;
  long lStack_48;
  
  nb_tests = nb_tests + 1;
  lVar3 = xmlParseFile();
  if (lVar3 == 0) {
    return 1;
  }
  filename_00 = temp_directory;
  pcVar4 = resultFilename(filename,temp_directory,".res");
  if (pcVar4 != (char *)0x0) {
    xmlSaveFile(pcVar4,lVar3);
    iVar1 = compareFiles(pcVar4,result);
    xmlFreeDoc(lVar3);
    lVar3 = xmlParseFile(pcVar4);
    if (lVar3 == 0) {
      return 1;
    }
    xmlSaveFile(pcVar4,lVar3);
    iVar2 = compareFiles(pcVar4,result);
    xmlFreeDoc(lVar3);
    unlink(pcVar4);
    free(pcVar4);
    return (uint)(iVar2 != 0 || iVar1 != 0);
  }
  oldParseTest_cold_1();
  uStack_50 = 1;
  nb_tests = nb_tests + 1;
  lStack_48 = lVar3;
  iVar1 = loadMem(filename,&pcStack_58,&iStack_5c);
  pcVar4 = pcStack_58;
  if (iVar1 == 0) {
    lVar3 = xmlReadMemory(pcStack_58,iStack_5c,filename,0,0);
    free(pcVar4);
    if (lVar3 == 0) {
      return 1;
    }
    xmlDocDumpMemory(lVar3,&pcStack_58,&iStack_5c);
    xmlFreeDoc(lVar3);
    iVar1 = compareFileMem(filename_00,pcStack_58,iStack_5c);
    if ((pcStack_58 != (char *)0x0) && (iVar1 == 0)) {
      (*_xmlFree)();
      return 0;
    }
    if (pcStack_58 != (char *)0x0) {
      (*_xmlFree)();
    }
    fprintf(_stderr,"Result for %s failed in %s\n",filename,filename_00);
  }
  else {
    fprintf(_stderr,"Failed to load %s\n",filename);
  }
  return -1;
}

Assistant:

static int
oldParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
#ifdef LIBXML_SAX1_ENABLED
    doc = xmlParseFile(filename);
#else
    doc = xmlReadFile(filename, NULL, 0);
#endif
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
#ifdef LIBXML_SAX1_ENABLED
    doc = xmlParseFile(temp);
#else
    doc = xmlReadFile(temp, NULL, 0);
#endif
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}